

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawSplineSegmentLinear(Vector2 p1,Vector2 p2,float thick,Color color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vector2 local_28;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  fVar1 = p2.x;
  fStack_c = p2.y;
  fStack_20 = p1.x;
  fStack_1c = p1.y;
  if (0.0 < thick) {
    fVar2 = fVar1 - fStack_20;
    fStack_10 = fStack_c - fStack_1c;
    fVar3 = SQRT(fVar2 * fVar2 + fStack_10 * fStack_10);
    if (0.0 < fVar3) {
      fVar3 = thick / (fVar3 + fVar3);
      local_18 = fStack_10 * -fVar3;
      fStack_10 = fStack_10 * -fVar3;
      local_28.x = fStack_20 - local_18;
      local_28.y = fStack_1c - fVar2 * fVar3;
      fStack_20 = fStack_20 + fStack_10;
      fStack_1c = fStack_1c + fVar2 * fVar3;
      local_18 = fVar1 - local_18;
      fStack_14 = fStack_c - fVar2 * fVar3;
      fStack_10 = fStack_10 + fVar1;
      fStack_c = fVar2 * fVar3 + fStack_c;
      DrawTriangleStrip(&local_28,4,color);
    }
  }
  return;
}

Assistant:

void DrawSplineSegmentLinear(Vector2 p1, Vector2 p2, float thick, Color color)
{
    // NOTE: For the linear spline we don't use subdivisions, just a single quad

    Vector2 delta = { p2.x - p1.x, p2.y - p1.y };
    float length = sqrtf(delta.x*delta.x + delta.y*delta.y);

    if ((length > 0) && (thick > 0))
    {
        float scale = thick/(2*length);

        Vector2 radius = { -scale*delta.y, scale*delta.x };
        Vector2 strip[4] = {
            { p1.x - radius.x, p1.y - radius.y },
            { p1.x + radius.x, p1.y + radius.y },
            { p2.x - radius.x, p2.y - radius.y },
            { p2.x + radius.x, p2.y + radius.y }
        };

        DrawTriangleStrip(strip, 4, color);
    }
}